

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

bool cmsys::SystemTools::Split
               (string *str,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *lines,char separator)

{
  pointer pcVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  string data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_58;
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  local_50 = local_40;
  pcVar1 = (str->_M_dataplus)._M_p;
  local_58 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)lines;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + str->_M_string_length);
  uVar5 = 0;
  do {
    uVar3 = uVar5;
    uVar2 = local_48;
    if (local_48 <= uVar3) break;
    lVar4 = std::__cxx11::string::find((char)(string *)&local_50,(ulong)(uint)(int)separator);
    if (lVar4 == -1) {
      std::__cxx11::string::substr((ulong)&local_78,(ulong)&local_50);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_58,&local_78);
      uVar5 = uVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::string::substr((ulong)&local_78,(ulong)&local_50);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_58,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      uVar5 = lVar4 + 1;
    }
  } while (lVar4 != -1);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return uVar2 <= uVar3;
}

Assistant:

bool SystemTools::Split(const kwsys_stl::string& str, kwsys_stl::vector<kwsys_stl::string>& lines, char separator)
{
  kwsys_stl::string data(str);
  kwsys_stl::string::size_type lpos = 0;
  while(lpos < data.length())
    {
    kwsys_stl::string::size_type rpos = data.find_first_of(separator, lpos);
    if(rpos == kwsys_stl::string::npos)
      {
      // Line ends at end of string without a newline.
      lines.push_back(data.substr(lpos));
      return false;
      }
    else
      {
      // Line ends in a "\n", remove the character.
      lines.push_back(data.substr(lpos, rpos-lpos));
      }
    lpos = rpos+1;
    }
  return true;
}